

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

double bson_iter_as_double(bson_iter_t *iter)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  _Bool _Var3;
  double dVar4;
  
  if (iter != (bson_iter_t *)0x0) {
    puVar2 = iter->raw;
    uVar1 = puVar2[iter->type];
    if (uVar1 == '\x01') {
      dVar4 = *(double *)(puVar2 + iter->d1);
    }
    else if (uVar1 == '\x12') {
      dVar4 = (double)*(long *)(puVar2 + iter->d1);
    }
    else if (uVar1 == '\x10') {
      dVar4 = (double)*(int *)(puVar2 + iter->d1);
    }
    else {
      dVar4 = 0.0;
      if (uVar1 == '\b') {
        _Var3 = bson_iter_bool(iter);
        dVar4 = (double)_Var3;
      }
    }
    return dVar4;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x403,"bson_iter_as_double","iter");
  abort();
}

Assistant:

double
bson_iter_as_double (const bson_iter_t *iter) /* IN */
{
   BSON_ASSERT (iter);

   switch ((int) ITER_TYPE (iter)) {
   case BSON_TYPE_BOOL:
      return (double) bson_iter_bool (iter);
   case BSON_TYPE_DOUBLE:
      return bson_iter_double (iter);
   case BSON_TYPE_INT32:
      return (double) bson_iter_int32 (iter);
   case BSON_TYPE_INT64:
      return (double) bson_iter_int64 (iter);
   default:
      return 0;
   }
}